

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall ConnmanTestMsg::FlushSendBuffer(ConnmanTestMsg *this,CNode *node)

{
  long lVar1;
  _Head_base<0UL,_Transport_*,_false> _Var2;
  long in_FS_OFFSET;
  undefined1 auStack_48 [24];
  long local_30;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock15;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock15,&node->cs_vSend,"node.cs_vSend",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
             ,0x51,false);
  std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::clear(&node->vSendMsg);
  node->m_send_memusage = 0;
  while( true ) {
    _Var2._M_head_impl =
         (node->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
         _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
         super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
    (*(_Var2._M_head_impl)->_vptr_Transport[7])(auStack_48,_Var2._M_head_impl,0);
    if (local_30 == 0) break;
    (*((node->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
       _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
       super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[8])();
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock15.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ConnmanTestMsg::FlushSendBuffer(CNode& node) const
{
    LOCK(node.cs_vSend);
    node.vSendMsg.clear();
    node.m_send_memusage = 0;
    while (true) {
        const auto& [to_send, _more, _msg_type] = node.m_transport->GetBytesToSend(false);
        if (to_send.empty()) break;
        node.m_transport->MarkBytesSent(to_send.size());
    }
}